

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_feof(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long *plVar1;
  jx9_value *pObj;
  long lVar2;
  anon_union_8_3_18420de5_for_x aVar3;
  char zBuf [4096];
  undefined1 auStack_1018 [4096];
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (plVar1 = (long *)((*apArg)->x).pOther, plVar1 == (long *)0x0)) ||
     (*(int *)((long)plVar1 + 0x34) != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
  }
  else {
    if (*plVar1 != 0) {
      if ((int)plVar1[4] == (int)plVar1[6]) {
        lVar2 = (**(code **)(*plVar1 + 0x30))(plVar1[1],auStack_1018,0x1000);
        if (0 < lVar2) {
          SyBlobAppend((SyBlob *)(plVar1 + 2),auStack_1018,(sxu32)lVar2);
        }
        aVar3.iVal._1_7_ = 0;
        aVar3.iVal._0_1_ = lVar2 < 1;
      }
      else {
        aVar3.rVal = 0.0;
      }
      goto LAB_0013d9f1;
    }
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,"null_stream");
  }
  aVar3.rVal = 4.94065645841247e-324;
LAB_0013d9f1:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  pObj->x = aVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_feof(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	int rc;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 1);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 1);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 1);
		return JX9_OK;
	}
	rc = SXERR_EOF;
	/* Perform the requested operation */
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Data is available */
		rc = JX9_OK;
	}else{
		char zBuf[4096];
		jx9_int64 n;
		/* Perform a buffered read */
		n = pStream->xRead(pDev->pHandle, zBuf, sizeof(zBuf));
		if( n > 0 ){
			/* Copy buffered data */
			SyBlobAppend(&pDev->sBuffer, zBuf, (sxu32)n);
			rc = JX9_OK;
		}
	}
	/* EOF or not */
	jx9_result_bool(pCtx, rc == SXERR_EOF);
	return JX9_OK;	
}